

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O3

ssize_t AbstractFileBuffer::read(int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ByteBuffer *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  long lVar6;
  long lVar7;
  FileBufferException *this_00;
  undefined4 in_register_0000003c;
  long *plVar8;
  long lVar9;
  CustomException anon_var_0;
  QString local_90 [4];
  
  plVar8 = (long *)CONCAT44(in_register_0000003c,__fd);
  pvVar4 = (void *)(**(code **)(*plVar8 + 0x80))();
  if (__buf < pvVar4) {
    __buf = pvVar4;
  }
  this = (ByteBuffer *)operator_new(0x28);
  ByteBuffer::ByteBuffer(this,(bufsize_t)__buf,2);
  iVar2 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[3])(this);
  iVar3 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[2])(this);
  if ((CONCAT44(extraout_var,iVar2) == 0) || (CONCAT44(extraout_var_00,iVar3) == 0)) {
    this_00 = (FileBufferException *)__cxa_allocate_exception(0x48);
    QString::QString(local_90,"Cannot allocate buffer");
    FileBufferException::FileBufferException(this_00,local_90);
    __cxa_throw(this_00,&FileBufferException::typeinfo,CustomException::~CustomException);
  }
  uVar1 = CONCAT44(extraout_var_00,iVar3) - 1;
  uVar5 = (**(code **)(*plVar8 + 0x78))(plVar8);
  if (uVar5 < uVar1) {
    lVar7 = 0;
    lVar9 = 0;
    do {
      lVar6 = QIODevice::read((char *)plVar8,CONCAT44(extraout_var,iVar2) + lVar9);
      lVar9 = lVar6 + lVar9;
      lVar6 = (**(code **)(*plVar8 + 0x78))(plVar8);
      if (lVar7 == lVar6) break;
      lVar7 = (**(code **)(*plVar8 + 0x78))(plVar8);
      uVar5 = (**(code **)(*plVar8 + 0x78))(plVar8);
    } while (uVar5 < uVar1);
  }
  else {
    lVar9 = 0;
  }
  Logger::append(D_INFO,"Read size: %lX",lVar9);
  return (ssize_t)this;
}

Assistant:

ByteBuffer* AbstractFileBuffer::read(QFile &fIn, bufsize_t minBufSize, const bool allowTruncate) //throws exceptions
{
    bufsize_t readableSize = getReadableSize(fIn);
    bufsize_t allocSize = (readableSize < minBufSize) ? minBufSize : readableSize;

    ByteBuffer *bufferedFile = NULL;
    do {
        try {
            bufferedFile = new ByteBuffer(allocSize); //throws exceptions
        }
        catch (CustomException)
        {
            if (!allowTruncate) throw;
            allocSize /= 2;
        }
    } while(!bufferedFile && allocSize);

    char *content = (char*) bufferedFile->getContent();
    bufsize_t contentSize = bufferedFile->getContentSize();

    if (!content || !contentSize) throw FileBufferException("Cannot allocate buffer");
    //printf("Reading...%lx , BUFSIZE_MAX = %lx\n", allocSize, BUFSIZE_MAX);

    bufsize_t readSize = 0;
    offset_t prevOffset = 0;
    offset_t maxOffset = contentSize - 1;

    while (offset_t(fIn.pos()) < maxOffset) {

        bufsize_t maxSize = contentSize - readSize;
        if (maxSize > FILEVIEW_MAXSIZE) maxSize = FILEVIEW_MAXSIZE;

        readSize += fIn.read(content + readSize,  maxSize);
        if (prevOffset == fIn.pos()) break; //cannot read more!
        prevOffset = fIn.pos();
    }
    Logger::append(Logger::D_INFO,
        "Read size: %lX",
        static_cast<unsigned long>(readSize)
    );
    return bufferedFile;
}